

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O3

void dump(FILE *stream)

{
  ulong uVar1;
  byte bVar2;
  pointer pAVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int i_4;
  uint uVar7;
  char *__format;
  AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *pAVar8;
  int i_1;
  int i;
  long lVar9;
  uint64_t mech;
  uint8_t value;
  uint64_t disktype;
  uint64_t p11type;
  uint64_t gen;
  allocator_type local_71;
  ulong local_70;
  vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  local_68;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar5 = readULong(stream,&local_38);
  if (!bVar5) {
    iVar6 = feof((FILE *)stream);
    if (iVar6 == 0) {
      corrupt(stream);
      return;
    }
    puts("empty file");
    return;
  }
  lVar9 = 0x38;
  do {
    printf("%02hhx ",local_38 >> ((byte)lVar9 & 0x3f) & 0xff);
    lVar9 = lVar9 + -8;
  } while (lVar9 != -8);
  printf("generation %lu\n",local_38);
  iVar6 = feof((FILE *)stream);
  do {
    if (iVar6 != 0) {
      return;
    }
    bVar5 = readULong(stream,&local_40);
    uVar1 = local_40;
    if (!bVar5) {
LAB_001096e6:
      corrupt(stream);
      return;
    }
    lVar9 = 0x38;
    do {
      printf("%02hhx ",uVar1 >> ((byte)lVar9 & 0x3f) & 0xff);
      lVar9 = lVar9 + -8;
    } while (lVar9 != -8);
    if (uVar1 >> 0x20 == 0) {
      dumpCKA(uVar1,0x30);
      putchar(10);
    }
    else {
      puts("overflow attribute type");
    }
    bVar5 = readULong(stream,&local_48);
    uVar4 = local_48;
    if (!bVar5) goto LAB_001096e6;
    lVar9 = 0x38;
    do {
      printf("%02hhx ",uVar4 >> ((byte)lVar9 & 0x3f) & 0xff);
      lVar9 = lVar9 + -8;
    } while (lVar9 != -8);
    switch(uVar4) {
    case 1:
      puts("boolean attribute");
      bVar5 = readBool(stream,(uint8_t *)&local_68);
      if (!bVar5) goto LAB_001096e6;
      bVar2 = (byte)local_68.
                    super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (uint)(byte)local_68.
                          super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      printf("%02hhx                      %s",(ulong)uVar7,"");
      __format = "(invalid) TRUE";
      if (uVar7 == 0xff) {
        __format = "TRUE";
      }
      if (bVar2 == 0) {
        __format = "FALSE";
      }
      printf(__format);
      goto LAB_0010964c;
    case 2:
      puts("unsigned long attribute");
      bVar5 = readULong(stream,(uint64_t *)&local_68);
      pAVar3 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar5) goto LAB_001096e6;
      lVar9 = 0x38;
      do {
        printf("%02hhx ",(ulong)pAVar3 >> ((byte)lVar9 & 0x3f) & 0xff);
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
      dumpCKx(uVar1,(uint64_t)pAVar3,0x30);
LAB_0010964c:
      putchar(10);
      break;
    case 3:
      puts("byte string attribute");
      bVar5 = readULong(stream,&local_70);
      uVar1 = local_70;
      if (!bVar5) goto LAB_001096e6;
      lVar9 = 0x38;
      do {
        printf("%02hhx ",uVar1 >> ((byte)lVar9 & 0x3f) & 0xff);
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
      if (0x3fffffff < uVar1) {
LAB_001096cc:
        puts("overflow length...");
        return;
      }
      printf("(length %lu)\n",uVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,uVar1,&local_71)
      ;
      bVar5 = readBytes(stream,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      if (bVar5) {
        dumpBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,false);
      }
      else {
        corrupt(stream);
      }
      if (local_68.
          super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0) {
        operator_delete(local_68.
                        super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar5) {
        return;
      }
      break;
    case 4:
      puts("attribute map attribute");
      bVar5 = readULong(stream,&local_70);
      uVar1 = local_70;
      if (!bVar5) goto LAB_001096e6;
      lVar9 = 0x38;
      do {
        printf("%02hhx ",uVar1 >> ((byte)lVar9 & 0x3f) & 0xff);
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
      if (0x3fffffff < uVar1) goto LAB_001096cc;
      printf("(length %lu)\n",uVar1);
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar5 = readMap(stream,uVar1,&local_68);
      pAVar8 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar5) {
        corrupt(stream);
        std::
        vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        ::~vector(&local_68);
        return;
      }
      for (; pAVar8 != local_68.
                       super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pAVar8 = pAVar8 + 1) {
        AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump(pAVar8);
      }
      std::
      vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~vector(&local_68);
      break;
    case 5:
      puts("mechanism set attribute");
      bVar5 = readULong(stream,(uint64_t *)&local_68);
      pAVar3 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar5) goto LAB_001096e6;
      lVar9 = 0x38;
      do {
        printf("%02hhx ",(ulong)pAVar3 >> ((byte)lVar9 & 0x3f) & 0xff);
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
      if ((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x3fffffff < pAVar3)
      goto LAB_001096cc;
      printf("(length %lu)\n",pAVar3);
      if (pAVar3 != (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0) {
        pAVar8 = (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
        do {
          bVar5 = readULong(stream,&local_70);
          uVar1 = local_70;
          if (!bVar5) goto LAB_001096e6;
          lVar9 = 0x38;
          do {
            printf("%02hhx ",uVar1 >> ((byte)lVar9 & 0x3f) & 0xff);
            lVar9 = lVar9 + -8;
          } while (lVar9 != -8);
          dumpCKM(uVar1,0x30);
          putchar(10);
          pAVar8 = (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)
                   ((long)&pAVar8->type + 1);
        } while (pAVar8 != pAVar3);
      }
      break;
    default:
      puts("unknown attribute format");
      goto LAB_001096e6;
    }
    iVar6 = feof((FILE *)stream);
  } while( true );
}

Assistant:

void dump(FILE* stream)
{
	uint64_t gen;
	if (!readULong(stream, gen))
	{
		if (feof(stream))
		{
			printf("empty file\n");
		}
		else
		{
			corrupt(stream);
		}
		return;
	}
	dumpULong(gen);
	printf("generation %lu\n", (unsigned long) gen);

	while (!feof(stream))
	{
		uint64_t p11type;
		if (!readULong(stream, p11type))
		{
			corrupt(stream);
			return;
		}
		dumpULong(p11type);
		if ((uint64_t)((uint32_t)p11type) != p11type)
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) p11type, 48);
			printf("\n");
		}

		uint64_t disktype;
		if (!readULong(stream, disktype))
		{
			corrupt(stream);
			return;
		}
		dumpULong(disktype);
		switch (disktype)
		{
		case BOOLEAN_ATTR:
			printf("boolean attribute\n");
			break;
		case ULONG_ATTR:
			printf("unsigned long attribute\n");
			break;
		case BYTES_ATTR:
			printf("byte string attribute\n");
			break;
		case ATTRMAP_ATTR:
			printf("attribute map attribute\n");
			break;
		case MECHSET_ATTR:
			printf("mechanism set attribute\n");
			break;
		default:
			printf("unknown attribute format\n");
			break;
		}

		if (disktype == BOOLEAN_ATTR)
		{
			uint8_t value;
			if (!readBool(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBool(value);
			printf("\n");
		}
		else if (disktype == ULONG_ATTR)
		{
			uint64_t value;
			if (!readULong(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpULong(value);
			dumpCKx(p11type, value, 48);
			printf("\n");
		}
		else if (disktype == BYTES_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<uint8_t> value((size_t) len);
			if (!readBytes(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBytes(value);
		}
		else if (disktype == ATTRMAP_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<Attribute> value;
			if (!readMap(stream, len, value))
			{
				corrupt(stream);
				return;
			}
			dumpMap(value);
		}
		else if (disktype == MECHSET_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			for (unsigned long i = 0; i < len; i++)
			{
				uint64_t mech;
				if (!readULong(stream, mech))
				{
					corrupt(stream);
					return;
				}
				dumpULong(mech);
				dumpCKM(mech, 48);
				printf("\n");
			}
		}
		else
		{
			corrupt(stream);
			return;
		}
	}
}